

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block_test.cc
# Opt level: O2

bool __thiscall leveldb::TestHashFilter::KeyMayMatch(TestHashFilter *this,Slice *key,Slice *filter)

{
  ulong uVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  uVar2 = Hash(key->data_,key->size_,1);
  uVar1 = 4;
  do {
    uVar3 = uVar1;
    if (filter->size_ < uVar3) break;
    uVar1 = uVar3 + 4;
  } while (uVar2 != *(uint32_t *)(filter->data_ + (uVar3 - 4)));
  return uVar3 <= filter->size_;
}

Assistant:

bool KeyMayMatch(const Slice& key, const Slice& filter) const override {
    uint32_t h = Hash(key.data(), key.size(), 1);
    for (size_t i = 0; i + 4 <= filter.size(); i += 4) {
      if (h == DecodeFixed32(filter.data() + i)) {
        return true;
      }
    }
    return false;
  }